

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_error_code(sqlite3_context *pCtx,int errCode)

{
  int in_ESI;
  _func_void_void_ptr *in_RDI;
  u8 unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  int local_10;
  
  local_10 = in_ESI;
  if (in_ESI == 0) {
    local_10 = -1;
  }
  *(int *)(in_RDI + 0x24) = local_10;
  if ((*(ushort *)(*(long *)in_RDI + 0x14) & 1) != 0) {
    sqlite3ErrStr(in_ESI);
    setResultStrOrError(pCtx,(char *)CONCAT44(errCode,in_stack_00000008),unaff_retaddr_00,
                        unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_result_error_code(sqlite3_context *pCtx, int errCode){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ) return;
#endif
  pCtx->isError = errCode ? errCode : -1;
#ifdef SQLITE_DEBUG
  if( pCtx->pVdbe ) pCtx->pVdbe->rcApp = errCode;
#endif
  if( pCtx->pOut->flags & MEM_Null ){
    setResultStrOrError(pCtx, sqlite3ErrStr(errCode), -1, SQLITE_UTF8,
                        SQLITE_STATIC);
  }
}